

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

int sndio_init(cubeb_conflict2 **context,char *context_name)

{
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var1;
  char *pcVar2;
  sio_hdl *psVar3;
  void *pvVar4;
  long *in_RDI;
  sio_hdl *hdl;
  void *libsndio;
  long local_20;
  int local_4;
  
  local_20 = dlopen("libsndio.so.7.0",1);
  if ((local_20 == 0) && (local_20 = dlopen("libsndio.so",1), local_20 == 0)) {
    local_4 = -1;
  }
  else {
    cubeb_sio_close = (_func_void_sio_hdl_ptr *)dlsym(local_20,"sio_close");
    if (cubeb_sio_close == (_func_void_sio_hdl_ptr *)0x0) {
      dlclose(local_20);
      local_4 = -1;
    }
    else {
      cubeb_sio_eof = (_func_int_sio_hdl_ptr *)dlsym(local_20,"sio_eof");
      if (cubeb_sio_eof == (_func_int_sio_hdl_ptr *)0x0) {
        dlclose(local_20);
        local_4 = -1;
      }
      else {
        cubeb_sio_getpar = (_func_int_sio_hdl_ptr_sio_par_ptr *)dlsym(local_20,"sio_getpar");
        if (cubeb_sio_getpar == (_func_int_sio_hdl_ptr_sio_par_ptr *)0x0) {
          dlclose(local_20);
          local_4 = -1;
        }
        else {
          cubeb_sio_initpar = (_func_void_sio_par_ptr *)dlsym(local_20,"sio_initpar");
          if (cubeb_sio_initpar == (_func_void_sio_par_ptr *)0x0) {
            dlclose(local_20);
            local_4 = -1;
          }
          else {
            cubeb_sio_nfds = (_func_int_sio_hdl_ptr *)dlsym(local_20,"sio_nfds");
            if (cubeb_sio_nfds == (_func_int_sio_hdl_ptr *)0x0) {
              dlclose(local_20);
              local_4 = -1;
            }
            else {
              cubeb_sio_onmove =
                   (_func_void_sio_hdl_ptr__func_void_void_ptr_int_ptr_void_ptr *)
                   dlsym(local_20,"sio_onmove");
              if (cubeb_sio_onmove ==
                  (_func_void_sio_hdl_ptr__func_void_void_ptr_int_ptr_void_ptr *)0x0) {
                dlclose(local_20);
                local_4 = -1;
              }
              else {
                cubeb_sio_open = (_func_sio_hdl_ptr_char_ptr_uint_int *)dlsym(local_20,"sio_open");
                if (cubeb_sio_open == (_func_sio_hdl_ptr_char_ptr_uint_int *)0x0) {
                  dlclose(local_20);
                  local_4 = -1;
                }
                else {
                  cubeb_sio_pollfd =
                       (_func_int_sio_hdl_ptr_pollfd_ptr_int *)dlsym(local_20,"sio_pollfd");
                  if (cubeb_sio_pollfd == (_func_int_sio_hdl_ptr_pollfd_ptr_int *)0x0) {
                    dlclose(local_20);
                    local_4 = -1;
                  }
                  else {
                    cubeb_sio_read =
                         (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)dlsym(local_20,"sio_read");
                    if (cubeb_sio_read == (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)0x0) {
                      dlclose(local_20);
                      local_4 = -1;
                    }
                    else {
                      cubeb_sio_revents =
                           (_func_int_sio_hdl_ptr_pollfd_ptr *)dlsym(local_20,"sio_revents");
                      if (cubeb_sio_revents == (_func_int_sio_hdl_ptr_pollfd_ptr *)0x0) {
                        dlclose(local_20);
                        local_4 = -1;
                      }
                      else {
                        cubeb_sio_setpar =
                             (_func_int_sio_hdl_ptr_sio_par_ptr *)dlsym(local_20,"sio_setpar");
                        if (cubeb_sio_setpar == (_func_int_sio_hdl_ptr_sio_par_ptr *)0x0) {
                          dlclose(local_20);
                          local_4 = -1;
                        }
                        else {
                          cubeb_sio_start = (_func_int_sio_hdl_ptr *)dlsym(local_20,"sio_start");
                          if (cubeb_sio_start == (_func_int_sio_hdl_ptr *)0x0) {
                            dlclose(local_20);
                            local_4 = -1;
                          }
                          else {
                            cubeb_sio_stop = (_func_int_sio_hdl_ptr *)dlsym(local_20,"sio_stop");
                            if (cubeb_sio_stop == (_func_int_sio_hdl_ptr *)0x0) {
                              dlclose(local_20);
                              local_4 = -1;
                            }
                            else {
                              cubeb_sio_write =
                                   (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)
                                   dlsym(local_20,"sio_write");
                              p_Var1 = cubeb_sio_open;
                              if (cubeb_sio_write == (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)0x0
                                 ) {
                                dlclose(local_20);
                                local_4 = -1;
                              }
                              else {
                                pcVar2 = sndio_get_device();
                                psVar3 = (*p_Var1)(pcVar2,1,1);
                                if (psVar3 == (sio_hdl *)0x0) {
                                  local_4 = -1;
                                }
                                else {
                                  (*cubeb_sio_close)(psVar3);
                                  pvVar4 = malloc(0x10);
                                  *in_RDI = (long)pvVar4;
                                  if (*in_RDI == 0) {
                                    local_4 = -1;
                                  }
                                  else {
                                    *(long *)(*in_RDI + 8) = local_20;
                                    *(cubeb_ops_conflict2 **)*in_RDI = &sndio_ops;
                                    local_4 = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int
sndio_init(cubeb **context, char const *context_name)
{
  void * libsndio = NULL;
  struct sio_hdl *hdl;

  assert(context);

#ifndef DISABLE_LIBSNDIO_DLOPEN
  libsndio = dlopen("libsndio.so.7.0", RTLD_LAZY);
  if (!libsndio) {
    libsndio = dlopen("libsndio.so", RTLD_LAZY);
    if (!libsndio) {
      DPR("sndio_init(%s) failed dlopen(libsndio.so)\n", context_name);
      return CUBEB_ERROR;
    }
  }

#define LOAD(x) {                               \
    cubeb_##x = dlsym(libsndio, #x);            \
    if (!cubeb_##x) {                           \
      DPR("sndio_init(%s) failed dlsym(%s)\n", context_name, #x); \
      dlclose(libsndio);                        \
      return CUBEB_ERROR;                       \
    }                                           \
  }

  LIBSNDIO_API_VISIT(LOAD);
#undef LOAD
#endif

  /* test if sndio works */
  hdl = WRAP(sio_open)(sndio_get_device(), SIO_PLAY, 1);
  if (hdl == NULL) {
    return CUBEB_ERROR;
  }
  WRAP(sio_close)(hdl);

  DPR("sndio_init(%s)\n", context_name);
  *context = malloc(sizeof(**context));
  if (*context == NULL)
	return CUBEB_ERROR;
  (*context)->libsndio = libsndio;
  (*context)->ops = &sndio_ops;
  (void)context_name;
  return CUBEB_OK;
}